

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestIncrementF<Counter<unsigned_char,4u>>(void)

{
  Counter<unsigned_char,_4U> local_55;
  uint local_54;
  uint local_50;
  uint ii_2;
  uint ii_1;
  Counter<unsigned_char,_4U> local_43;
  Counter<unsigned_char,_4U> local_42;
  bool local_41;
  uint ii;
  Counter<unsigned_char,_4U> b;
  Counter<unsigned_char,_4U> a;
  
  Counter<unsigned_char,_4U>::Counter(&local_42,'\n');
  Counter<unsigned_char,_4U>::Counter(&local_43,&local_42);
  for (ii_1 = 0; ii_1 < 5; ii_1 = ii_1 + 1) {
    local_42.Value = local_42.Value + 1 & 0xf;
  }
  Counter<unsigned_char,_4U>::Counter((Counter<unsigned_char,_4U> *)((long)&ii_2 + 3),'\x0f');
  if (local_42.Value == ii_2._3_1_) {
    for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
      local_42.Value = local_42.Value + 1 & 0xf;
    }
    for (local_54 = 0; local_54 < 10; local_54 = local_54 + 1) {
      local_42.Value = local_42.Value - 1 & 0xf;
    }
    Counter<unsigned_char,_4U>::Counter(&local_55,&local_43);
    if (local_42.Value == local_55.Value) {
      local_41 = true;
    }
    else {
      local_41 = false;
    }
  }
  else {
    local_41 = false;
  }
  return local_41;
}

Assistant:

bool TestIncrementF()
{
    CounterT a = CounterT::kMask - 5;
    const CounterT b = a;

    for (unsigned ii = 0; ii < 5; ++ii)
        ++a;

    TEST_CHECK(a == CounterT::kMask);

    for (unsigned ii = 0; ii < 5; ++ii)
        ++a;
    for (unsigned ii = 0; ii < 10; ++ii)
        --a;

    TEST_CHECK(a == b);

    return true;
}